

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2vd_parser.c
# Opt level: O3

MPP_RET m2vd_parser_deinit(void *ctx)

{
  void *ptr;
  long lVar1;
  
  ptr = *ctx;
  if (((byte)m2vd_debug & 1) != 0) {
    _mpp_log_l(4,"m2vd_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_I",0x109,
               "m2vd_parser_deinit");
  }
  if (*(FILE **)((long)ptr + 0x2f8) != (FILE *)0x0) {
    fclose(*(FILE **)((long)ptr + 0x2f8));
  }
  *(undefined8 *)((long)ptr + 0x2f8) = 0;
  if (*(FILE **)((long)ptr + 0x300) != (FILE *)0x0) {
    fclose(*(FILE **)((long)ptr + 0x300));
  }
  *(undefined8 *)((long)ptr + 0x300) = 0;
  if (*(void **)((long)ptr + 0x18) != (void *)0x0) {
    mpp_osal_free("m2vd_parser_deinit",*(void **)((long)ptr + 0x18));
    *(undefined8 *)((long)ptr + 0x18) = 0;
  }
  if (*(void **)((long)ptr + 0x20) != (void *)0x0) {
    mpp_osal_free("m2vd_parser_deinit",*(void **)((long)ptr + 0x20));
    *(undefined8 *)((long)ptr + 0x20) = 0;
  }
  if (*(long *)((long)ptr + 0x2b8) != 0) {
    mpp_packet_deinit((MppPacket *)((long)ptr + 0x2b8));
  }
  if (*(void **)((long)ptr + 8) != (void *)0x0) {
    mpp_osal_free("m2vd_parser_deinit",*(void **)((long)ptr + 8));
    *(undefined8 *)((long)ptr + 8) = 0;
  }
  if (*(void **)((long)ptr + 0x10) != (void *)0x0) {
    mpp_osal_free("m2vd_parser_deinit",*(void **)((long)ptr + 0x10));
    *(undefined8 *)((long)ptr + 0x10) = 0;
  }
  lVar1 = 0x208;
  do {
    mpp_frame_deinit((MppFrame *)((long)ptr + lVar1));
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0x2c8);
  if (ptr != (void *)0x0) {
    mpp_osal_free("m2vd_parser_deinit",ptr);
  }
  if (((byte)m2vd_debug & 1) != 0) {
    _mpp_log_l(4,"m2vd_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_O",0x12e,
               "m2vd_parser_deinit");
  }
  return MPP_OK;
}

Assistant:

MPP_RET m2vd_parser_deinit(void *ctx)
{
    RK_U32 k = 0;
    MPP_RET ret = MPP_OK;
    M2VDContext *c = (M2VDContext *)ctx;
    M2VDParserContext *p = (M2VDParserContext *)c->parse_ctx;

    m2vd_dbg_func("FUN_I");

    for (k = 0; k < M2VD_DBG_FILE_NUM; k++) {
        M2VD_FCLOSE(p->fp_dbg_file[k]);
    }
    M2VD_FCLOSE(p->fp_dbg_yuv);

    if (p->bitstream_sw_buf) {
        mpp_free(p->bitstream_sw_buf);
        p->bitstream_sw_buf = NULL;
    }
    if (p->qp_tab_sw_buf) {
        mpp_free(p->qp_tab_sw_buf);
        p->qp_tab_sw_buf = NULL;
    }

    if (p->input_packet) {
        mpp_packet_deinit(&p->input_packet);
    }

    if (p->dxva_ctx) {
        mpp_free(p->dxva_ctx);
        p->dxva_ctx = NULL;
    }
    if (p->bitread_ctx) {
        mpp_free(p->bitread_ctx);
        p->bitread_ctx = NULL;
    }

    for (k = 0; k < 3; k++) {
        mpp_frame_deinit(&p->Framehead[k].f);
    }

    if (p) {
        mpp_free(p);
    }

    m2vd_dbg_func("FUN_O");
    return ret;
}